

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

Gia_Man_t * Dam_ManMultiAig(Dam_Man_t *pMan)

{
  int iVar1;
  int Entry;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_4c;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p;
  Dam_Man_t *pMan_local;
  
  pGVar7 = pMan->pGia;
  iVar1 = Gia_ManObjNum(pGVar7);
  p_00 = Gia_ManStart(iVar1 << 1);
  pcVar3 = Abc_UtilStrsav(pGVar7->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pGVar7->pSpec);
  p_00->pSpec = pcVar3;
  puVar4 = (uint *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pMuxes = puVar4;
  pVVar5 = Vec_IntStart(p_00->nObjsAlloc);
  p_00->vLevels = pVVar5;
  Gia_ManFillValue(pGVar7);
  pGVar6 = Gia_ManConst0(pGVar7);
  pGVar6->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGVar7->vCis);
    bVar8 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCi(pGVar7,local_34);
      bVar8 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGStack_30->Value = uVar2;
    pVVar5 = p_00->vLevels;
    iVar1 = Abc_Lit2Var(pGStack_30->Value);
    Entry = Gia_ObjLevel(pGVar7,pGStack_30);
    Vec_IntWriteEntry(pVVar5,iVar1,Entry);
    local_34 = local_34 + 1;
  }
  Gia_ManHashStart(p_00);
  iVar1 = Gia_ManBufNum(pGVar7);
  if (iVar1 == 0) {
    local_4c = pGVar7->nObjs;
  }
  else {
    local_4c = 0;
  }
  local_34 = local_4c;
  while( true ) {
    bVar8 = false;
    if (local_34 < pGVar7->nObjs) {
      pGStack_30 = Gia_ManObj(pGVar7,local_34);
      bVar8 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsBuf(pGStack_30);
    if (iVar1 != 0) {
      pGVar6 = Gia_ObjFanin0(pGStack_30);
      Dam_ManMultiAig_rec(pMan,p_00,pGVar7,pGVar6);
      iVar1 = Gia_ObjFanin0Copy(pGStack_30);
      uVar2 = Gia_ManAppendBuf(p_00,iVar1);
      pGStack_30->Value = uVar2;
      iVar1 = Abc_Lit2Var(pGStack_30->Value);
      pGVar6 = Gia_ManObj(p_00,iVar1);
      Gia_ObjSetGateLevel(p_00,pGVar6);
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGVar7->vCos);
    bVar8 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(pGVar7,local_34);
      bVar8 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pGVar6 = Gia_ObjFanin0(pGStack_30);
    Dam_ManMultiAig_rec(pMan,p_00,pGVar7,pGVar6);
    iVar1 = Gia_ObjFanin0Copy(pGStack_30);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_30->Value = uVar2;
    local_34 = local_34 + 1;
  }
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(pGVar7);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Dam_ManMultiAig( Dam_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        Vec_IntWriteEntry( pNew->vLevels, Abc_Lit2Var(pObj->Value), Gia_ObjLevel(p, pObj) );
    }
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachBuf( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Dam_ManMultiAig_rec( pMan, pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}